

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

string * __thiscall
CLI::ConfigBase::to_config
          (ConfigBase *this,App *app,bool default_also,bool write_description,string *prefix)

{
  byte bVar1;
  byte bVar2;
  bool bVar3;
  __type_conflict _Var4;
  int iVar5;
  App *pAVar6;
  reference ppOVar7;
  Option *this_00;
  string *psVar8;
  reference ppAVar9;
  size_t sVar10;
  ostream *poVar11;
  byte in_CL;
  App *in_RDX;
  undefined8 *in_RSI;
  string *in_RDI;
  byte in_R8B;
  string *in_R9;
  string pname;
  App *p;
  string appname;
  string subname;
  App *subcom_1;
  iterator __end1_2;
  iterator __begin1_2;
  vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_> *__range1_2;
  App *subcom;
  iterator __end1_1;
  iterator __begin1_1;
  vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_> *__range1_1;
  vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_> subcommands;
  string name;
  ArgumentMismatch *anon_var_0_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *test_name;
  const_iterator __end7;
  const_iterator __begin7;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range7;
  bool valid;
  ArgumentMismatch *anon_var_0;
  string value;
  string single_name;
  Option *opt;
  iterator __end2;
  iterator __begin2;
  vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> *__range2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *group;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  bool defaultUsed;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  groups;
  string keyChars;
  string commentTest;
  string commentLead;
  stringstream out;
  int in_stack_fffffffffffff618;
  undefined4 in_stack_fffffffffffff61c;
  App *in_stack_fffffffffffff620;
  const_iterator in_stack_fffffffffffff628;
  undefined6 in_stack_fffffffffffff630;
  byte in_stack_fffffffffffff636;
  byte in_stack_fffffffffffff637;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff638;
  _Alloc_hider in_stack_fffffffffffff640;
  undefined6 in_stack_fffffffffffff648;
  byte in_stack_fffffffffffff64e;
  byte in_stack_fffffffffffff64f;
  allocator<char> *in_stack_fffffffffffff650;
  allocator<char> *__a;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff658;
  App *in_stack_fffffffffffff660;
  Option *in_stack_fffffffffffff668;
  App *in_stack_fffffffffffff670;
  App *in_stack_fffffffffffff698;
  undefined8 in_stack_fffffffffffff6a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffff6a8;
  char in_stack_fffffffffffff6c0;
  string *in_stack_fffffffffffff6e0;
  string *in_stack_fffffffffffff6e8;
  undefined8 uVar12;
  function<bool_(const_CLI::App_*)> *in_stack_fffffffffffff700;
  App *in_stack_fffffffffffff708;
  string *in_stack_fffffffffffff798;
  Option *name_00;
  string *in_stack_fffffffffffff7c0;
  App *in_stack_fffffffffffff7c8;
  undefined1 in_stack_fffffffffffff885;
  char in_stack_fffffffffffff886;
  char in_stack_fffffffffffff887;
  string *in_stack_fffffffffffff888;
  undefined1 local_760 [32];
  string local_740 [39];
  allocator<char> local_719;
  undefined1 local_718 [32];
  string local_6f8 [64];
  undefined1 local_6b8 [200];
  _Alloc_hider local_5f0;
  App **local_5e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5e0;
  undefined1 local_5d0 [32];
  string local_5b0 [32];
  _Any_data local_590;
  __normal_iterator<const_CLI::App_**,_std::vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>_>
  local_580;
  _Invoker_type local_578;
  undefined1 local_550 [24];
  string local_538 [64];
  string local_4f8 [368];
  string local_388 [64];
  Option *local_348;
  undefined4 local_33c;
  Option **local_338;
  __normal_iterator<const_CLI::Option_**,_std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>_>
  local_330 [5];
  undefined1 local_308 [24];
  undefined1 *local_2f0;
  reference local_2e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2e0;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2d8;
  undefined1 *local_2d0;
  string local_2a8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_288;
  allocator<char> local_279 [33];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_258;
  byte local_241;
  undefined1 local_240 [63];
  allocator<char> local_201 [49];
  string local_1d0 [32];
  stringstream local_1b0 [16];
  byte local_1a;
  byte local_19;
  App *local_18;
  
  local_19 = in_CL & 1;
  local_1a = in_R8B & 1;
  local_18 = in_RDX;
  ::std::__cxx11::stringstream::stringstream(local_1b0);
  ::std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff637,
                      CONCAT16(in_stack_fffffffffffff636,in_stack_fffffffffffff630)));
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff637,
                      CONCAT16(in_stack_fffffffffffff636,in_stack_fffffffffffff630)),
             (char)((ulong)in_stack_fffffffffffff628._M_current >> 0x38));
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff637,
                      CONCAT16(in_stack_fffffffffffff636,in_stack_fffffffffffff630)),
             (char)((ulong)in_stack_fffffffffffff628._M_current >> 0x38));
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff660,(char *)in_stack_fffffffffffff658,in_stack_fffffffffffff650);
  ::std::allocator<char>::~allocator(local_201);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff637,
                      CONCAT16(in_stack_fffffffffffff636,in_stack_fffffffffffff630)),
             (char)((ulong)in_stack_fffffffffffff628._M_current >> 0x38));
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff637,
                      CONCAT16(in_stack_fffffffffffff636,in_stack_fffffffffffff630)),
             (char)((ulong)in_stack_fffffffffffff628._M_current >> 0x38));
  ::std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff660,in_stack_fffffffffffff658);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff637,
                      CONCAT16(in_stack_fffffffffffff636,in_stack_fffffffffffff630)),
             (char)((ulong)in_stack_fffffffffffff628._M_current >> 0x38));
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff637,
                      CONCAT16(in_stack_fffffffffffff636,in_stack_fffffffffffff630)),
             (char)((ulong)in_stack_fffffffffffff628._M_current >> 0x38));
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff637,
                      CONCAT16(in_stack_fffffffffffff636,in_stack_fffffffffffff630)),
             (char)((ulong)in_stack_fffffffffffff628._M_current >> 0x38));
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff637,
                      CONCAT16(in_stack_fffffffffffff636,in_stack_fffffffffffff630)),
             (char)((ulong)in_stack_fffffffffffff628._M_current >> 0x38));
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff637,
                      CONCAT16(in_stack_fffffffffffff636,in_stack_fffffffffffff630)),
             (char)((ulong)in_stack_fffffffffffff628._M_current >> 0x38));
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff637,
                      CONCAT16(in_stack_fffffffffffff636,in_stack_fffffffffffff630)),
             (char)((ulong)in_stack_fffffffffffff628._M_current >> 0x38));
  App::get_groups_abi_cxx11_(in_stack_fffffffffffff698);
  local_241 = 0;
  local_258 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)CONCAT44(in_stack_fffffffffffff61c,in_stack_fffffffffffff618));
  __gnu_cxx::
  __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
  ::__normal_iterator<std::__cxx11::string*>
            ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)in_stack_fffffffffffff620,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)CONCAT44(in_stack_fffffffffffff61c,in_stack_fffffffffffff618));
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff660,(char *)in_stack_fffffffffffff658,in_stack_fffffffffffff650);
  local_288 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::insert((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)in_stack_fffffffffffff620,in_stack_fffffffffffff628,
                       (value_type *)CONCAT44(in_stack_fffffffffffff61c,in_stack_fffffffffffff618));
  ::std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff620);
  ::std::allocator<char>::~allocator(local_279);
  if ((local_1a & 1) != 0) {
    bVar3 = App::get_configurable(local_18);
    if ((!bVar3) && (pAVar6 = App::get_parent(local_18), pAVar6 != (App *)0x0)) {
      App::get_name_abi_cxx11_(local_18);
      bVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         0x18359f);
      if (!bVar3) goto LAB_0018376b;
    }
    poVar11 = ::std::operator<<((ostream *)&stack0xfffffffffffffe60,local_1d0);
    App::get_description_abi_cxx11_
              ((App *)CONCAT44(in_stack_fffffffffffff61c,in_stack_fffffffffffff618));
    CLI::detail::fix_newlines(in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e0);
    poVar11 = ::std::operator<<(poVar11,local_2a8);
    ::std::operator<<(poVar11,'\n');
    ::std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff620);
    ::std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff620);
  }
LAB_0018376b:
  local_2d0 = local_240;
  local_2d8._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)CONCAT44(in_stack_fffffffffffff61c,in_stack_fffffffffffff618));
  local_2e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)CONCAT44(in_stack_fffffffffffff61c,in_stack_fffffffffffff618));
  do {
    bVar3 = __gnu_cxx::
            operator==<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)in_stack_fffffffffffff620,
                       (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)CONCAT44(in_stack_fffffffffffff61c,in_stack_fffffffffffff618));
    if (((bVar3 ^ 0xffU) & 1) == 0) {
      std::function<bool_(const_CLI::App_*)>::function
                ((function<bool_(const_CLI::App_*)> *)in_stack_fffffffffffff620);
      App::get_subcommands(in_stack_fffffffffffff708,in_stack_fffffffffffff700);
      std::function<bool_(const_CLI::App_*)>::~function
                ((function<bool_(const_CLI::App_*)> *)0x1843eb);
      local_578 = (_Invoker_type)local_550;
      local_580._M_current =
           (App **)std::vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>::begin
                             ((vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_> *)
                              CONCAT44(in_stack_fffffffffffff61c,in_stack_fffffffffffff618));
      local_590._8_8_ =
           std::vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>::end
                     ((vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_> *)
                      CONCAT44(in_stack_fffffffffffff61c,in_stack_fffffffffffff618));
      while (bVar3 = __gnu_cxx::
                     operator==<const_CLI::App_**,_std::vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>_>
                               ((__normal_iterator<const_CLI::App_**,_std::vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>_>
                                 *)in_stack_fffffffffffff620,
                                (__normal_iterator<const_CLI::App_**,_std::vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>_>
                                 *)CONCAT44(in_stack_fffffffffffff61c,in_stack_fffffffffffff618)),
            ((bVar3 ^ 0xffU) & 1) != 0) {
        ppAVar9 = __gnu_cxx::
                  __normal_iterator<const_CLI::App_**,_std::vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>_>
                  ::operator*(&local_580);
        local_590._M_unused._M_object = *ppAVar9;
        App::get_name_abi_cxx11_((App *)local_590._M_unused._0_8_);
        bVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x184481)
        ;
        if ((bVar3) &&
           (((local_19 & 1) != 0 ||
            (sVar10 = App::count_all(in_stack_fffffffffffff660), sVar10 != 0)))) {
          if ((local_1a & 1) != 0) {
            App::get_group_abi_cxx11_((App *)local_590._M_unused._0_8_);
            bVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            0x18452f);
            if (!bVar3) {
              poVar11 = ::std::operator<<((ostream *)&stack0xfffffffffffffe60,'\n');
              poVar11 = ::std::operator<<(poVar11,local_1d0);
              psVar8 = App::get_group_abi_cxx11_((App *)local_590._M_unused._0_8_);
              poVar11 = ::std::operator<<(poVar11,(string *)psVar8);
              ::std::operator<<(poVar11," Options\n");
            }
          }
          bVar2 = local_19;
          bVar1 = local_1a;
          poVar11 = (ostream *)&stack0xfffffffffffffe60;
          uVar12 = local_590._M_unused._0_8_;
          ::std::__cxx11::string::string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff660,in_stack_fffffffffffff658);
          (**(code **)*in_RSI)(local_5b0,in_RSI,uVar12,bVar2 & 1,bVar1 & 1,local_5d0);
          ::std::operator<<(poVar11,local_5b0);
          ::std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff620);
          ::std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff620);
        }
        __gnu_cxx::
        __normal_iterator<const_CLI::App_**,_std::vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>_>
        ::operator++(&local_580);
      }
      local_5e0._8_8_ = local_550;
      local_5e0._M_allocated_capacity =
           (size_type)
           std::vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>::begin
                     ((vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_> *)
                      CONCAT44(in_stack_fffffffffffff61c,in_stack_fffffffffffff618));
      local_5e8 = (App **)std::vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>::end
                                    ((vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_> *)
                                     CONCAT44(in_stack_fffffffffffff61c,in_stack_fffffffffffff618));
      while (bVar3 = __gnu_cxx::
                     operator==<const_CLI::App_**,_std::vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>_>
                               ((__normal_iterator<const_CLI::App_**,_std::vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>_>
                                 *)in_stack_fffffffffffff620,
                                (__normal_iterator<const_CLI::App_**,_std::vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>_>
                                 *)CONCAT44(in_stack_fffffffffffff61c,in_stack_fffffffffffff618)),
            ((bVar3 ^ 0xffU) & 1) != 0) {
        ppAVar9 = __gnu_cxx::
                  __normal_iterator<const_CLI::App_**,_std::vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>_>
                  ::operator*((__normal_iterator<const_CLI::App_**,_std::vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>_>
                               *)&local_5e0._M_allocated_capacity);
        local_5f0._M_p = (pointer)*ppAVar9;
        App::get_name_abi_cxx11_((App *)local_5f0._M_p);
        bVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x184780)
        ;
        if ((!bVar3) &&
           (((local_19 & 1) != 0 ||
            (sVar10 = App::count_all(in_stack_fffffffffffff660), sVar10 != 0)))) {
          App::get_name_abi_cxx11_((App *)local_5f0._M_p);
          ::std::__cxx11::string::string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff660,in_stack_fffffffffffff658);
          clean_name_string((string *)in_stack_fffffffffffff640._M_p,in_stack_fffffffffffff638);
          bVar3 = App::get_configurable((App *)local_5f0._M_p);
          if ((bVar3) &&
             (((local_19 & 1) != 0 ||
              (bVar3 = App::got_subcommand(in_stack_fffffffffffff620,
                                           (App *)CONCAT44(in_stack_fffffffffffff61c,
                                                           in_stack_fffffffffffff618)), bVar3)))) {
            bVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            0x18486c);
            if ((bVar3) && (pAVar6 = App::get_parent(local_18), pAVar6 != (App *)0x0)) {
              App::get_name_abi_cxx11_(local_18);
              ::std::__cxx11::string::string
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffff660,in_stack_fffffffffffff658);
              clean_name_string((string *)in_stack_fffffffffffff640._M_p,in_stack_fffffffffffff638);
              ::std::operator+(in_stack_fffffffffffff638,in_stack_fffffffffffff637);
              ::std::operator+(in_stack_fffffffffffff628._M_current,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_fffffffffffff620);
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        in_stack_fffffffffffff670,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        in_stack_fffffffffffff668);
              ::std::__cxx11::string::~string
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffff620);
              ::std::__cxx11::string::~string
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffff620);
              local_6b8._64_8_ = App::get_parent(local_18);
              while (pAVar6 = App::get_parent((App *)local_6b8._64_8_), pAVar6 != (App *)0x0) {
                App::get_name_abi_cxx11_((App *)local_6b8._64_8_);
                ::std::__cxx11::string::string
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffff660,in_stack_fffffffffffff658);
                clean_name_string((string *)in_stack_fffffffffffff640._M_p,in_stack_fffffffffffff638
                                 );
                ::std::operator+(in_stack_fffffffffffff638,in_stack_fffffffffffff637);
                ::std::operator+(in_stack_fffffffffffff628._M_current,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)in_stack_fffffffffffff620);
                in_stack_fffffffffffff668 = (Option *)local_6b8;
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_fffffffffffff670,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_fffffffffffff668);
                ::std::__cxx11::string::~string
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffff620);
                ::std::__cxx11::string::~string
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffff620);
                in_stack_fffffffffffff670 = App::get_parent((App *)local_6b8._64_8_);
                local_6b8._64_8_ = in_stack_fffffffffffff670;
                ::std::__cxx11::string::~string
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffff620);
              }
              in_stack_fffffffffffff660 =
                   (App *)::std::operator<<((ostream *)&stack0xfffffffffffffe60,'[');
              in_stack_fffffffffffff658 =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ::std::operator<<((ostream *)in_stack_fffffffffffff660,
                                     (string *)(local_6b8 + 0xa8));
              ::std::operator<<((ostream *)in_stack_fffffffffffff658,"]\n");
              ::std::__cxx11::string::~string
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffff620);
            }
            else {
              poVar11 = ::std::operator<<((ostream *)&stack0xfffffffffffffe60,'[');
              poVar11 = ::std::operator<<(poVar11,in_R9);
              poVar11 = ::std::operator<<(poVar11,(string *)(local_6b8 + 0xa8));
              ::std::operator<<(poVar11,"]\n");
            }
            in_stack_fffffffffffff638 =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &stack0xfffffffffffffe60;
            __a = &local_719;
            in_stack_fffffffffffff640._M_p = local_5f0._M_p;
            in_stack_fffffffffffff64e = local_19;
            in_stack_fffffffffffff64f = local_1a;
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string<std::allocator<char>>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff660,(char *)in_stack_fffffffffffff658,__a);
            (**(code **)*in_RSI)
                      (local_6f8,in_RSI,in_stack_fffffffffffff640._M_p,in_stack_fffffffffffff64e & 1
                       ,in_stack_fffffffffffff64f & 1,local_718);
            ::std::operator<<((ostream *)in_stack_fffffffffffff638,local_6f8);
            ::std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff620);
            ::std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff620);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_719);
          }
          else {
            in_stack_fffffffffffff620 = (App *)&stack0xfffffffffffffe60;
            in_stack_fffffffffffff628._M_current =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5f0._M_p
            ;
            in_stack_fffffffffffff636 = local_19;
            in_stack_fffffffffffff637 = local_1a;
            ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT17(in_stack_fffffffffffff64f,
                                      CONCAT16(in_stack_fffffffffffff64e,in_stack_fffffffffffff648))
                             ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffff640._M_p);
            ::std::operator+(in_stack_fffffffffffff628._M_current,
                             (char)((ulong)in_stack_fffffffffffff620 >> 0x38));
            (**(code **)*in_RSI)
                      (local_740,in_RSI,in_stack_fffffffffffff628._M_current,
                       in_stack_fffffffffffff636 & 1,in_stack_fffffffffffff637 & 1,local_760);
            ::std::operator<<((ostream *)in_stack_fffffffffffff620,local_740);
            ::std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff620);
            ::std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff620);
            ::std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff620);
          }
          ::std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff620);
        }
        __gnu_cxx::
        __normal_iterator<const_CLI::App_**,_std::vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>_>
        ::operator++((__normal_iterator<const_CLI::App_**,_std::vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>_>
                      *)&local_5e0._M_allocated_capacity);
      }
      ::std::__cxx11::stringstream::str();
      local_33c = 1;
      std::vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>::~vector
                ((vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_> *)
                 CONCAT17(in_stack_fffffffffffff637,
                          CONCAT16(in_stack_fffffffffffff636,in_stack_fffffffffffff630)));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)CONCAT17(in_stack_fffffffffffff637,
                            CONCAT16(in_stack_fffffffffffff636,in_stack_fffffffffffff630)));
      ::std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff620);
      ::std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff620);
      ::std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff620);
      ::std::__cxx11::stringstream::~stringstream(local_1b0);
      return in_RDI;
    }
    local_2e8 = __gnu_cxx::
                __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator*(&local_2d8);
    bVar3 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffff620,
                              (char *)CONCAT44(in_stack_fffffffffffff61c,in_stack_fffffffffffff618))
    ;
    if ((bVar3) ||
       (bVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x183811)
       , bVar3)) {
      if ((local_241 & 1) == 0) {
        local_241 = 1;
        goto LAB_0018382e;
      }
    }
    else {
LAB_0018382e:
      if ((((local_1a & 1) != 0) &&
          (bVar3 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)in_stack_fffffffffffff620,
                                     (char *)CONCAT44(in_stack_fffffffffffff61c,
                                                      in_stack_fffffffffffff618)),
          ((bVar3 ^ 0xffU) & 1) != 0)) &&
         (bVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        0x183878), !bVar3)) {
        poVar11 = ::std::operator<<((ostream *)&stack0xfffffffffffffe60,'\n');
        poVar11 = ::std::operator<<(poVar11,local_1d0);
        poVar11 = ::std::operator<<(poVar11,(string *)local_2e8);
        ::std::operator<<(poVar11," Options\n");
      }
      std::function<bool_(const_CLI::Option_*)>::function
                ((function<bool_(const_CLI::Option_*)> *)in_stack_fffffffffffff620);
      App::get_options(in_stack_fffffffffffff7c8,
                       (function<bool_(const_CLI::Option_*)> *)in_stack_fffffffffffff7c0);
      std::function<bool_(const_CLI::Option_*)>::~function
                ((function<bool_(const_CLI::Option_*)> *)0x18393f);
      local_2f0 = local_308;
      local_330[0]._M_current =
           (Option **)
           std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>::begin
                     ((vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> *)
                      CONCAT44(in_stack_fffffffffffff61c,in_stack_fffffffffffff618));
      local_338 = (Option **)
                  std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>::end
                            ((vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> *)
                             CONCAT44(in_stack_fffffffffffff61c,in_stack_fffffffffffff618));
      while (bVar3 = __gnu_cxx::
                     operator==<const_CLI::Option_**,_std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>_>
                               ((__normal_iterator<const_CLI::Option_**,_std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>_>
                                 *)in_stack_fffffffffffff620,
                                (__normal_iterator<const_CLI::Option_**,_std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>_>
                                 *)CONCAT44(in_stack_fffffffffffff61c,in_stack_fffffffffffff618)),
            ((bVar3 ^ 0xffU) & 1) != 0) {
        ppOVar7 = __gnu_cxx::
                  __normal_iterator<const_CLI::Option_**,_std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>_>
                  ::operator*(local_330);
        local_348 = *ppOVar7;
        bVar3 = OptionBase<CLI::Option>::get_configurable(&local_348->super_OptionBase<CLI::Option>)
        ;
        if (bVar3) {
          OptionBase<CLI::Option>::get_group_abi_cxx11_(&local_348->super_OptionBase<CLI::Option>);
          _Var4 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)in_stack_fffffffffffff640._M_p,in_stack_fffffffffffff638);
          if (((_Var4 ^ 0xffU) & 1) == 0) {
LAB_00183abb:
            in_stack_fffffffffffff7c0 =
                 Option::get_single_name_abi_cxx11_
                           ((Option *)CONCAT44(in_stack_fffffffffffff61c,in_stack_fffffffffffff618))
            ;
            ::std::__cxx11::string::string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff660,in_stack_fffffffffffff658);
            bVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            0x183af6);
            if (bVar3) {
              local_33c = 5;
            }
            else {
              Option::reduced_results_abi_cxx11_(in_stack_fffffffffffff668);
              in_stack_fffffffffffff618 = (int)*(char *)((long)in_RSI + 0x26);
              CLI::detail::ini_join
                        (in_stack_fffffffffffff6a8,(char)((ulong)in_stack_fffffffffffff6a0 >> 0x38),
                         (char)((ulong)in_stack_fffffffffffff6a0 >> 0x30),
                         (char)((ulong)in_stack_fffffffffffff6a0 >> 0x28),
                         (char)((ulong)in_stack_fffffffffffff6a0 >> 0x20),in_stack_fffffffffffff6c0)
              ;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)CONCAT17(in_stack_fffffffffffff637,
                                    CONCAT16(in_stack_fffffffffffff636,in_stack_fffffffffffff630)));
              bVar3 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)0x183b77);
              if ((bVar3) && ((local_19 & 1) != 0)) {
                Option::get_default_str_abi_cxx11_
                          ((Option *)CONCAT44(in_stack_fffffffffffff61c,in_stack_fffffffffffff618));
                bVar3 = std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)0x183bb2);
                ::std::__cxx11::string::~string
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffff620);
                if (((bVar3 ^ 0xffU) & 1) == 0) {
                  iVar5 = Option::get_expected_min(local_348);
                  if (iVar5 == 0) {
                    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_fffffffffffff620,
                                (char *)CONCAT44(in_stack_fffffffffffff61c,in_stack_fffffffffffff618
                                                ));
                  }
                  else {
                    bVar3 = Option::get_run_callback_for_default(local_348);
                    if (bVar3) {
                      std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)in_stack_fffffffffffff620,
                                 (char *)CONCAT44(in_stack_fffffffffffff61c,
                                                  in_stack_fffffffffffff618));
                    }
                  }
                }
                else {
                  Option::get_default_str_abi_cxx11_
                            ((Option *)CONCAT44(in_stack_fffffffffffff61c,in_stack_fffffffffffff618)
                            );
                  CLI::detail::convert_arg_for_ini
                            (in_stack_fffffffffffff888,in_stack_fffffffffffff887,
                             in_stack_fffffffffffff886,(bool)in_stack_fffffffffffff885);
                  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffff670,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffff668);
                  ::std::__cxx11::string::~string
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_fffffffffffff620);
                  ::std::__cxx11::string::~string
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_fffffffffffff620);
                }
              }
              bVar3 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)0x183d53);
              if (!bVar3) {
                this_00 = (Option *)Option::get_fnames_abi_cxx11_(local_348);
                bVar3 = std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)CONCAT17(in_stack_fffffffffffff637,
                                            CONCAT16(in_stack_fffffffffffff636,
                                                     in_stack_fffffffffffff630)));
                if (!bVar3) {
                  name_00 = local_348;
                  ::std::__cxx11::string::string
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_fffffffffffff660,in_stack_fffffffffffff658);
                  Option::get_flag_value(this_00,(string *)name_00,in_stack_fffffffffffff798);
                  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffff670,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffff668);
                  ::std::__cxx11::string::~string
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_fffffffffffff620);
                  ::std::__cxx11::string::~string
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_fffffffffffff620);
                }
                if (((local_1a & 1) != 0) &&
                   (bVar3 = Option::has_description((Option *)0x184100), bVar3)) {
                  ::std::operator<<((ostream *)&stack0xfffffffffffffe60,'\n');
                  poVar11 = ::std::operator<<((ostream *)&stack0xfffffffffffffe60,local_1d0);
                  Option::get_description_abi_cxx11_(local_348);
                  ::std::__cxx11::string::string
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_fffffffffffff660,in_stack_fffffffffffff658);
                  CLI::detail::fix_newlines(in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e0);
                  poVar11 = ::std::operator<<(poVar11,local_4f8);
                  ::std::operator<<(poVar11,'\n');
                  ::std::__cxx11::string::~string
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_fffffffffffff620);
                  ::std::__cxx11::string::~string
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_fffffffffffff620);
                }
                clean_name_string((string *)in_stack_fffffffffffff640._M_p,in_stack_fffffffffffff638
                                 );
                ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)CONCAT17(in_stack_fffffffffffff64f,
                                             CONCAT16(in_stack_fffffffffffff64e,
                                                      in_stack_fffffffffffff648)),
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)in_stack_fffffffffffff640._M_p);
                poVar11 = ::std::operator<<((ostream *)&stack0xfffffffffffffe60,local_538);
                poVar11 = ::std::operator<<(poVar11,*(char *)((long)in_RSI + 0x24));
                poVar11 = ::std::operator<<(poVar11,local_388);
                ::std::operator<<(poVar11,'\n');
                ::std::__cxx11::string::~string
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffff620);
              }
              ::std::__cxx11::string::~string
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffff620);
              local_33c = 0;
            }
            ::std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff620);
          }
          else {
            bVar3 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)in_stack_fffffffffffff620,
                                      (char *)CONCAT44(in_stack_fffffffffffff61c,
                                                       in_stack_fffffffffffff618));
            if (bVar3) {
              in_stack_fffffffffffff7c8 =
                   (App *)OptionBase<CLI::Option>::get_group_abi_cxx11_
                                    (&local_348->super_OptionBase<CLI::Option>);
              bVar3 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)0x183a97);
              if (bVar3) goto LAB_00183abb;
            }
          }
        }
        __gnu_cxx::
        __normal_iterator<const_CLI::Option_**,_std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>_>
        ::operator++(local_330);
      }
      local_33c = 4;
      std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>::~vector
                ((vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> *)
                 CONCAT17(in_stack_fffffffffffff637,
                          CONCAT16(in_stack_fffffffffffff636,in_stack_fffffffffffff630)));
    }
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_2d8);
  } while( true );
}

Assistant:

CLI11_INLINE std::string
ConfigBase::to_config(const App *app, bool default_also, bool write_description, std::string prefix) const {
    std::stringstream out;
    std::string commentLead;
    commentLead.push_back(commentChar);
    commentLead.push_back(' ');

    std::string commentTest = "#;";
    commentTest.push_back(commentChar);
    commentTest.push_back(parentSeparatorChar);

    std::string keyChars = commentTest;
    keyChars.push_back(literalQuote);
    keyChars.push_back(stringQuote);
    keyChars.push_back(arrayStart);
    keyChars.push_back(arrayEnd);
    keyChars.push_back(valueDelimiter);
    keyChars.push_back(arraySeparator);

    std::vector<std::string> groups = app->get_groups();
    bool defaultUsed = false;
    groups.insert(groups.begin(), std::string("Options"));
    if(write_description && (app->get_configurable() || app->get_parent() == nullptr || app->get_name().empty())) {
        out << commentLead << detail::fix_newlines(commentLead, app->get_description()) << '\n';
    }
    for(auto &group : groups) {
        if(group == "Options" || group.empty()) {
            if(defaultUsed) {
                continue;
            }
            defaultUsed = true;
        }
        if(write_description && group != "Options" && !group.empty()) {
            out << '\n' << commentLead << group << " Options\n";
        }
        for(const Option *opt : app->get_options({})) {

            // Only process options that are configurable
            if(opt->get_configurable()) {
                if(opt->get_group() != group) {
                    if(!(group == "Options" && opt->get_group().empty())) {
                        continue;
                    }
                }
                std::string single_name = opt->get_single_name();
                if(single_name.empty()) {
                    continue;
                }

                std::string value = detail::ini_join(
                    opt->reduced_results(), arraySeparator, arrayStart, arrayEnd, stringQuote, literalQuote);
                
                if(value.empty() && default_also) {
                    if(!opt->get_default_str().empty()) {
                        value = detail::convert_arg_for_ini(opt->get_default_str(), stringQuote, literalQuote, false);
                    } else if(opt->get_expected_min() == 0) {
                        value = "false";
                    } else if(opt->get_run_callback_for_default()) {
                        value = "\"\"";  // empty string default value
                    }
                }

                if(!value.empty()) {

                    if(!opt->get_fnames().empty()) {
                        try {
                            value = opt->get_flag_value(single_name, value);
                        } catch(const CLI::ArgumentMismatch &) {
                            bool valid{false};
                            for(const auto &test_name : opt->get_fnames()) {
                                try {
                                    value = opt->get_flag_value(test_name, value);
                                    single_name = test_name;
                                    valid = true;
                                } catch(const CLI::ArgumentMismatch &) {
                                    continue;
                                }
                            }
                            if(!valid) {
                                value = detail::ini_join(
                                    opt->results(), arraySeparator, arrayStart, arrayEnd, stringQuote, literalQuote);
                            }
                        }
                    }
                    if(write_description && opt->has_description()) {
                        out << '\n';
                        out << commentLead << detail::fix_newlines(commentLead, opt->get_description()) << '\n';
                    }
                    clean_name_string(single_name, keyChars);

                    std::string name = prefix + single_name;

                    out << name << valueDelimiter << value << '\n';
                }
            }
        }
    }
    auto subcommands = app->get_subcommands({});
    for(const App *subcom : subcommands) {
        if(subcom->get_name().empty()) {
            if(!default_also && (subcom->count_all() == 0)) {
                continue;
            }
            if(write_description && !subcom->get_group().empty()) {
                out << '\n' << commentLead << subcom->get_group() << " Options\n";
            }
            /*if (!prefix.empty() || app->get_parent() == nullptr) {
                out << '[' << prefix << "___"<< subcom->get_group() << "]\n";
            } else {
                std::string subname = app->get_name() + parentSeparatorChar + "___"+subcom->get_group();
                const auto *p = app->get_parent();
                while(p->get_parent() != nullptr) {
                    subname = p->get_name() + parentSeparatorChar +subname;
                    p = p->get_parent();
                }
                out << '[' << subname << "]\n";
            }
            */
            out << to_config(subcom, default_also, write_description, prefix);
        }
    }

    for(const App *subcom : subcommands) {
        if(!subcom->get_name().empty()) {
            if(!default_also && (subcom->count_all() == 0)) {
                continue;
            }
            std::string subname = subcom->get_name();
            clean_name_string(subname, keyChars);

            if(subcom->get_configurable() && (default_also || app->got_subcommand(subcom))) {
                if(!prefix.empty() || app->get_parent() == nullptr) {

                    out << '[' << prefix << subname << "]\n";
                } else {
                    std::string appname = app->get_name();
                    clean_name_string(appname, keyChars);
                    subname = appname + parentSeparatorChar + subname;
                    const auto *p = app->get_parent();
                    while(p->get_parent() != nullptr) {
                        std::string pname = p->get_name();
                        clean_name_string(pname, keyChars);
                        subname = pname + parentSeparatorChar + subname;
                        p = p->get_parent();
                    }
                    out << '[' << subname << "]\n";
                }
                out << to_config(subcom, default_also, write_description, "");
            } else {
                out << to_config(subcom, default_also, write_description, prefix + subname + parentSeparatorChar);
            }
        }
    }

    return out.str();
}